

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O2

void clsolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  singlecomplex *psVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  singlecomplex *psVar9;
  float fVar10;
  float fVar11;
  float fVar13;
  singlecomplex sVar12;
  float fVar14;
  float fVar15;
  singlecomplex sVar16;
  singlecomplex sVar17;
  singlecomplex sVar18;
  float fVar19;
  singlecomplex sVar20;
  singlecomplex sVar21;
  singlecomplex sVar22;
  singlecomplex sVar23;
  float fVar24;
  
  lVar3 = (long)ldm;
  lVar7 = (long)(ldm * 4 + 4);
  pfVar4 = &M[2].i;
  lVar5 = 2;
  psVar9 = rhs;
  for (uVar6 = 0; (long)uVar6 < (long)(ncol + -3); uVar6 = uVar6 + 4) {
    fVar10 = rhs[uVar6].i;
    fVar19 = -fVar10;
    fVar2 = rhs[uVar6].r;
    fVar11 = rhs[uVar6 + 1].r - (M[1].r * fVar2 + M[1].i * fVar19);
    fVar13 = rhs[uVar6 + 1].i - (M[1].r * fVar10 + M[1].i * fVar2);
    fVar24 = -fVar13;
    fVar14 = (rhs[uVar6 + 2].r - (M[2].r * fVar2 + M[2].i * fVar19)) -
             (M[lVar3 + 2].r * fVar11 + M[lVar3 + 2].i * fVar24);
    fVar15 = (rhs[uVar6 + 2].i - (M[2].r * fVar10 + M[2].i * fVar2)) -
             (M[lVar3 + 2].r * fVar13 + M[lVar3 + 2].i * fVar11);
    sVar16.r = ((rhs[uVar6 + 3].r - (M[3].r * fVar2 + M[3].i * fVar19)) -
               (M[lVar3 + 3].r * fVar11 + M[lVar3 + 3].i * fVar24)) -
               (M[lVar3 * 2 + 3].r * fVar14 + M[lVar3 * 2 + 3].i * -fVar15);
    sVar16.i = ((rhs[uVar6 + 3].i - (M[3].r * fVar10 + M[3].i * fVar2)) -
               (M[lVar3 + 3].r * fVar13 + M[lVar3 + 3].i * fVar11)) -
               (M[lVar3 * 2 + 3].r * fVar15 + M[lVar3 * 2 + 3].i * fVar14);
    psVar1 = rhs + uVar6 + 1;
    psVar1->r = fVar11;
    psVar1->i = fVar13;
    psVar1[1].r = fVar14;
    psVar1[1].i = fVar15;
    rhs[uVar6 + 3] = sVar16;
    for (lVar8 = 4; (int)uVar6 + (int)lVar8 < ncol; lVar8 = lVar8 + 1) {
      psVar1 = M + lVar8;
      sVar20.r = psVar9[lVar8].r - (psVar1->r * fVar2 + psVar1->i * fVar19);
      sVar20.i = psVar9[lVar8].i - (psVar1->r * fVar10 + psVar1->i * fVar2);
      psVar9[lVar8] = sVar20;
      sVar21.r = sVar20.r - (psVar1[lVar3].r * fVar11 + psVar1[lVar3].i * fVar24);
      sVar21.i = sVar20.i - (psVar1[lVar3].r * fVar13 + psVar1[lVar3].i * fVar11);
      psVar9[lVar8] = sVar21;
      sVar22.r = sVar21.r - (psVar1[lVar3 * 2].r * fVar14 + psVar1[lVar3 * 2].i * -fVar15);
      sVar22.i = sVar21.i - (psVar1[lVar3 * 2].r * fVar15 + psVar1[lVar3 * 2].i * fVar14);
      psVar9[lVar8] = sVar22;
      sVar23.r = sVar22.r - (psVar1[lVar3 * 3].r * sVar16.r + psVar1[lVar3 * 3].i * -sVar16.i);
      sVar23.i = sVar22.i - (psVar1[lVar3 * 3].r * sVar16.i + psVar1[lVar3 * 3].i * sVar16.r);
      psVar9[lVar8] = sVar23;
    }
    M = M + lVar7;
    lVar5 = lVar5 + 4;
    pfVar4 = pfVar4 + lVar7 * 2;
    psVar9 = psVar9 + 4;
  }
  if ((int)uVar6 < ncol + -1) {
    uVar6 = uVar6 & 0xffffffff;
    fVar10 = rhs[uVar6].i;
    fVar2 = rhs[uVar6].r;
    sVar12.r = rhs[uVar6 + 1].r - (M[1].r * fVar2 + M[1].i * -fVar10);
    sVar12.i = rhs[uVar6 + 1].i - (M[1].r * fVar10 + M[1].i * fVar2);
    rhs[uVar6 + 1] = sVar12;
    for (; lVar5 < ncol; lVar5 = lVar5 + 1) {
      sVar17.r = rhs[lVar5].r - (((singlecomplex *)(pfVar4 + -1))->r * fVar2 + *pfVar4 * -fVar10);
      sVar17.i = rhs[lVar5].i - (((singlecomplex *)(pfVar4 + -1))->r * fVar10 + *pfVar4 * fVar2);
      rhs[lVar5] = sVar17;
      sVar18.r = sVar17.r - (pfVar4[lVar3 * 2 + -1] * sVar12.r + pfVar4[lVar3 * 2] * -sVar12.i);
      sVar18.i = sVar17.i - (pfVar4[lVar3 * 2 + -1] * sVar12.i + pfVar4[lVar3 * 2] * sVar12.r);
      rhs[lVar5] = sVar18;
      pfVar4 = pfVar4 + 2;
    }
  }
  return;
}

Assistant:

void clsolve ( int ldm, int ncol, singlecomplex *M, singlecomplex *rhs )
{
    int k;
    singlecomplex x0, x1, x2, x3, temp;
    singlecomplex *M0;
    singlecomplex *Mki0, *Mki1, *Mki2, *Mki3;
    register int firstcol = 0;

    M0 = &M[0];


    while ( firstcol < ncol - 3 ) { /* Do 4 columns */
      	Mki0 = M0 + 1;
      	Mki1 = Mki0 + ldm + 1;
      	Mki2 = Mki1 + ldm + 1;
      	Mki3 = Mki2 + ldm + 1;

      	x0 = rhs[firstcol];
      	cc_mult(&temp, &x0, Mki0); Mki0++;
      	c_sub(&x1, &rhs[firstcol+1], &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x2, &rhs[firstcol+2], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x2, &x2, &temp);
      	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x3, &rhs[firstcol+3], &temp);
	cc_mult(&temp, &x1, Mki1); Mki1++;
	c_sub(&x3, &x3, &temp);
	cc_mult(&temp, &x2, Mki2); Mki2++;
	c_sub(&x3, &x3, &temp);

 	rhs[++firstcol] = x1;
      	rhs[++firstcol] = x2;
      	rhs[++firstcol] = x3;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x2, Mki2); Mki2++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x3, Mki3); Mki3++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	}

        M0 += 4 * ldm + 4;
    }

    if ( firstcol < ncol - 1 ) { /* Do 2 columns */
        Mki0 = M0 + 1;
        Mki1 = Mki0 + ldm + 1;

        x0 = rhs[firstcol];
	cc_mult(&temp, &x0, Mki0); Mki0++;
	c_sub(&x1, &rhs[firstcol+1], &temp);

      	rhs[++firstcol] = x1;
      	++firstcol;
    
      	for (k = firstcol; k < ncol; k++) {
	    cc_mult(&temp, &x0, Mki0); Mki0++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	    cc_mult(&temp, &x1, Mki1); Mki1++;
	    c_sub(&rhs[k], &rhs[k], &temp);
	} 
    }
    
}